

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::print_shader_params_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,UsdTransform2d *shader,uint32_t indent)

{
  tinyusdz *ptVar1;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *attr;
  _Base_ptr this_00;
  uint indent_00;
  uint32_t in_R8D;
  string local_330;
  allocator local_309;
  undefined1 local_308 [32];
  string local_2e8;
  allocator local_2c1;
  undefined1 local_2c0 [32];
  string local_2a0;
  allocator local_279;
  undefined1 local_278 [32];
  string local_258;
  allocator local_231;
  string local_230;
  string local_210;
  allocator local_1e9;
  undefined1 local_1e8 [32];
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint local_1c;
  array<float,_2UL> aStack_18;
  uint32_t indent_local;
  UsdTransform2d *shader_local;
  
  local_1c = (uint)shader;
  aStack_18._M_elems = (_Type)this;
  shader_local = (UsdTransform2d *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  ptVar1 = (tinyusdz *)((long)aStack_18._M_elems + 0x730);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_1e8,"inputs:in",&local_1e9);
  print_typed_attr<std::array<float,2ul>>
            ((string *)(local_1e8 + 0x20),ptVar1,
             (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)local_1e8
             ,(string *)(ulong)local_1c,in_R8D);
  ::std::operator<<(aoStack_198,(string *)(local_1e8 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_1e8 + 0x20));
  ::std::__cxx11::string::~string((string *)local_1e8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  attr = (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
         ((long)aStack_18._M_elems + 0x9c8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_230,"inputs:rotation",&local_231);
  print_typed_attr<float>(&local_210,attr,&local_230,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_210);
  ::std::__cxx11::string::~string((string *)&local_210);
  ::std::__cxx11::string::~string((string *)&local_230);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_231);
  ptVar1 = (tinyusdz *)((long)aStack_18._M_elems + 0xc50);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_278,"inputs:scale",&local_279);
  print_typed_attr<std::array<float,2ul>>
            ((string *)(local_278 + 0x20),ptVar1,
             (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)local_278
             ,(string *)(ulong)local_1c,in_R8D);
  ::std::operator<<(aoStack_198,(string *)(local_278 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_278 + 0x20));
  ::std::__cxx11::string::~string((string *)local_278);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_279);
  ptVar1 = (tinyusdz *)((long)aStack_18._M_elems + 0xee8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_2c0,"inputs:translation",&local_2c1);
  print_typed_attr<std::array<float,2ul>>
            ((string *)(local_2c0 + 0x20),ptVar1,
             (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)local_2c0
             ,(string *)(ulong)local_1c,in_R8D);
  ::std::operator<<(aoStack_198,(string *)(local_2c0 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_2c0 + 0x20));
  ::std::__cxx11::string::~string((string *)local_2c0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  this_00 = (_Base_ptr)((long)aStack_18._M_elems + 0x1180);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_308,"outputs:result",&local_309);
  indent_00 = local_1c;
  print_typed_terminal_attr<std::array<float,2ul>>
            ((string *)(local_308 + 0x20),(tinyusdz *)this_00,
             (TypedTerminalAttribute<std::array<float,_2UL>_> *)local_308,(string *)(ulong)local_1c,
             in_R8D);
  ::std::operator<<(aoStack_198,(string *)(local_308 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_308 + 0x20));
  ::std::__cxx11::string::~string((string *)local_308);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_309);
  print_common_shader_params_abi_cxx11_
            (&local_330,(tinyusdz *)aStack_18._M_elems,(ShaderNode *)(ulong)local_1c,indent_00);
  ::std::operator<<(aoStack_198,(string *)&local_330);
  ::std::__cxx11::string::~string((string *)&local_330);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

static std::string print_shader_params(const UsdTransform2d &shader,
                                       const uint32_t indent) {
  std::stringstream ss;

  ss << print_typed_attr(shader.in, "inputs:in", indent);
  ss << print_typed_attr(shader.rotation, "inputs:rotation", indent);
  ss << print_typed_attr(shader.scale, "inputs:scale", indent);
  ss << print_typed_attr(shader.translation, "inputs:translation", indent);
  ss << print_typed_terminal_attr(shader.result, "outputs:result", indent);

  ss << print_common_shader_params(shader, indent);

  return ss.str();
}